

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDTree.hpp
# Opt level: O1

vector<P_*,_std::allocator<P_*>_> * __thiscall
kdtree::KDTree<P,_3U,_P_new,_P_delete,_P_set,_P_less>::queryRectangle
          (vector<P_*,_std::allocator<P_*>_> *__return_storage_ptr__,
          KDTree<P,_3U,_P_new,_P_delete,_P_set,_P_less> *this,Node *node,P *searchMin,P *searchMax,
          P *currentRegionMin,P *currentRegionMax,uint depth)

{
  pointer *pppPVar1;
  iterator __position;
  bool bVar2;
  P *regionMax;
  P *regionMin;
  P *regionMax_00;
  uint uVar3;
  string *psVar4;
  int i;
  int iVar5;
  undefined1 local_68 [8];
  vector<P_*,_std::allocator<P_*>_> resultLeft;
  
  (__return_storage_ptr__->super__Vector_base<P_*,_std::allocator<P_*>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<P_*,_std::allocator<P_*>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<P_*,_std::allocator<P_*>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (node->left == (Node *)0x0) {
    bVar2 = nodeInSearchRange(this,searchMin,searchMax,node);
    if (bVar2) {
      __position._M_current =
           (__return_storage_ptr__->super__Vector_base<P_*,_std::allocator<P_*>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (__return_storage_ptr__->super__Vector_base<P_*,_std::allocator<P_*>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<P*,std::allocator<P*>>::_M_realloc_insert<P*const&>
                  ((vector<P*,std::allocator<P*>> *)__return_storage_ptr__,__position,&node->value);
      }
      else {
        *__position._M_current = node->value;
        pppPVar1 = &(__return_storage_ptr__->super__Vector_base<P_*,_std::allocator<P_*>_>)._M_impl.
                    super__Vector_impl_data._M_finish;
        *pppPVar1 = *pppPVar1 + 1;
      }
    }
  }
  else {
    resultLeft.super__Vector_base<P_*,_std::allocator<P_*>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)P_new::operator()((P_new *)local_68);
    regionMax = P_new::operator()((P_new *)local_68);
    regionMin = P_new::operator()((P_new *)local_68);
    regionMax_00 = P_new::operator()((P_new *)local_68);
    psVar4 = (string *)
             (resultLeft.super__Vector_base<P_*,_std::allocator<P_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage + 2);
    iVar5 = 0;
    do {
      if (iVar5 == 2) {
        std::__cxx11::string::_M_assign(psVar4);
LAB_0010383d:
        if (iVar5 == 2) {
          std::__cxx11::string::_M_assign((string *)&regionMax->d2);
        }
        else if (iVar5 == 1) {
          regionMax->d1 = currentRegionMax->d1;
        }
        else {
          if (iVar5 != 0) goto LAB_001038ff;
          regionMax->d0 = currentRegionMax->d0;
        }
        if (iVar5 == 2) {
          std::__cxx11::string::_M_assign((string *)&regionMin->d2);
        }
        else if (iVar5 == 1) {
          regionMin->d1 = currentRegionMin->d1;
        }
        else {
          if (iVar5 != 0) goto LAB_001038ff;
          regionMin->d0 = currentRegionMin->d0;
        }
        if (iVar5 == 2) {
          std::__cxx11::string::_M_assign((string *)&regionMax_00->d2);
        }
        else if (iVar5 == 1) {
          regionMax_00->d1 = currentRegionMax->d1;
        }
        else if (iVar5 == 0) {
          regionMax_00->d0 = currentRegionMax->d0;
        }
      }
      else {
        if (iVar5 == 1) {
          resultLeft.super__Vector_base<P_*,_std::allocator<P_*>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage[1] = (P *)currentRegionMin->d1;
          goto LAB_0010383d;
        }
        if (iVar5 == 0) {
          *(int *)resultLeft.super__Vector_base<P_*,_std::allocator<P_*>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage = currentRegionMin->d0;
          goto LAB_0010383d;
        }
      }
LAB_001038ff:
      iVar5 = iVar5 + 1;
    } while (iVar5 != 3);
    uVar3 = depth % 3;
    if (uVar3 == 2) {
      std::__cxx11::string::_M_assign((string *)&regionMax->d2);
    }
    else if (uVar3 == 1) {
      regionMax->d1 = node->value->d1;
    }
    else {
      regionMax->d0 = node->value->d0;
    }
    if (uVar3 == 2) {
      std::__cxx11::string::_M_assign((string *)&regionMin->d2);
    }
    else if (uVar3 == 1) {
      regionMin->d1 = node->value->d1;
    }
    else {
      regionMin->d0 = node->value->d0;
    }
    bVar2 = regionContained(this,searchMin,searchMax,
                            (P *)resultLeft.super__Vector_base<P_*,_std::allocator<P_*>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage,regionMax);
    if (bVar2) {
      reportSubtree(this,node->left,__return_storage_ptr__);
    }
    else {
      bVar2 = regionIntersects(this,searchMin,searchMax,
                               (P *)resultLeft.super__Vector_base<P_*,_std::allocator<P_*>_>._M_impl
                                    .super__Vector_impl_data._M_end_of_storage,regionMax);
      if (bVar2) {
        queryRectangle((vector<P_*,_std::allocator<P_*>_> *)local_68,this,node->left,searchMin,
                       searchMax,
                       (P *)resultLeft.super__Vector_base<P_*,_std::allocator<P_*>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage,regionMax,depth + 1);
        std::vector<P*,std::allocator<P*>>::
        _M_range_insert<__gnu_cxx::__normal_iterator<P**,std::vector<P*,std::allocator<P*>>>>
                  ((vector<P*,std::allocator<P*>> *)__return_storage_ptr__,
                   (__return_storage_ptr__->super__Vector_base<P_*,_std::allocator<P_*>_>)._M_impl.
                   super__Vector_impl_data._M_finish,local_68,
                   resultLeft.super__Vector_base<P_*,_std::allocator<P_*>_>._M_impl.
                   super__Vector_impl_data._M_start);
        if (local_68 != (undefined1  [8])0x0) {
          operator_delete((void *)local_68);
        }
      }
    }
    bVar2 = regionContained(this,searchMin,searchMax,regionMin,regionMax_00);
    if (bVar2) {
      reportSubtree(this,node->right,__return_storage_ptr__);
    }
    else {
      bVar2 = regionIntersects(this,searchMin,searchMax,regionMin,regionMax_00);
      if (bVar2) {
        queryRectangle((vector<P_*,_std::allocator<P_*>_> *)local_68,this,node->right,searchMin,
                       searchMax,regionMin,regionMax_00,depth + 1);
        std::vector<P*,std::allocator<P*>>::
        _M_range_insert<__gnu_cxx::__normal_iterator<P**,std::vector<P*,std::allocator<P*>>>>
                  ((vector<P*,std::allocator<P*>> *)__return_storage_ptr__,
                   (__return_storage_ptr__->super__Vector_base<P_*,_std::allocator<P_*>_>)._M_impl.
                   super__Vector_impl_data._M_finish,local_68,
                   resultLeft.super__Vector_base<P_*,_std::allocator<P_*>_>._M_impl.
                   super__Vector_impl_data._M_start);
        if (local_68 != (undefined1  [8])0x0) {
          operator_delete((void *)local_68);
        }
      }
    }
    P_delete::operator()
              ((P_delete *)local_68,
               (P *)resultLeft.super__Vector_base<P_*,_std::allocator<P_*>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
    P_delete::operator()((P_delete *)local_68,regionMax);
    P_delete::operator()((P_delete *)local_68,regionMin);
    P_delete::operator()((P_delete *)local_68,regionMax_00);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<T*> queryRectangle(Node * const node, T * const searchMin, T * const searchMax, T * const currentRegionMin, T * const currentRegionMax, const unsigned int depth) const {
			std::vector<T*> result;

			// if node->left == nullptr then also node->right == nullptr.
			// this means we reached a leaf of the tree
			if (node->left == nullptr) {
				// if the leaf is within the search range, add it to the result vector
				if (nodeInSearchRange(searchMin, searchMax, node)) {
					result.push_back(node->value);
				}
			}
			else {
				T *leftRegionMin = NEW()();
				T *leftRegionMax = NEW()();
				T *rightRegionMin = NEW()();
				T *rightRegionMax = NEW()();

				for (int i = 0; i < dim; i++) {
					SET()(leftRegionMin, currentRegionMin, i);
					SET()(leftRegionMax, currentRegionMax, i);
					SET()(rightRegionMin, currentRegionMin, i);
					SET()(rightRegionMax, currentRegionMax, i);
				}

				SET()(leftRegionMax, node->value, depth%dim);
				SET()(rightRegionMin, node->value, depth%dim);

				if (regionContained(searchMin, searchMax, leftRegionMin, leftRegionMax)) {
					reportSubtree(node->left, &result);
				}
				else {
					if (regionIntersects(searchMin, searchMax, leftRegionMin, leftRegionMax)) {
						std::vector<T*> resultLeft = queryRectangle(node->left, searchMin, searchMax, leftRegionMin, leftRegionMax, depth + 1);
						result.insert(result.end(), resultLeft.begin(), resultLeft.end());
					}
				}

				if (regionContained(searchMin, searchMax, rightRegionMin, rightRegionMax)) {
					reportSubtree(node->right, &result);
				}
				else {
					if (regionIntersects(searchMin, searchMax, rightRegionMin, rightRegionMax)) {
						std::vector<T*> resultRight = queryRectangle(node->right, searchMin, searchMax, rightRegionMin, rightRegionMax, depth + 1);
						result.insert(result.end(), resultRight.begin(), resultRight.end());
					}
				}

				DELETE()(leftRegionMin);
				DELETE()(leftRegionMax);
				DELETE()(rightRegionMin);
				DELETE()(rightRegionMax);
			}
			return result;
		}